

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

string * ApprovalTests::StringUtils::rightTrim(string *s)

{
  string *in_RSI;
  string *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  string *this;
  undefined8 local_48;
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  char *local_20;
  undefined8 local_18;
  
  this = in_RDI;
  ::std::__cxx11::string::rbegin();
  ::std::__cxx11::string::rend();
  ::std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::__0>
            (&local_28,local_30,local_38);
  local_20 = (char *)std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::base(&local_28);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,in_stack_ffffffffffffff88);
  ::std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,in_stack_ffffffffffffff88);
  ::std::__cxx11::string::erase(in_RSI,local_18,local_48);
  ::std::__cxx11::string::string(this,in_RSI);
  return in_RDI;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::rightTrim(std::string s)
    {
        s.erase(std::find_if(s.rbegin(),
                             s.rend(),
                             [](unsigned char ch) { return !std::isspace(ch); })
                    .base(),
                s.end());
        return s;
    }